

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void google::protobuf::UninterpretedOption_NamePart::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_00235b42:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
LAB_00235af0:
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,arena);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_00235b02;
    if ((unaff_EBP & 1) != 0) {
      uVar1 = from_msg[1]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
      value = (string *)(uVar1 & 0xfffffffffffffffc);
      this = (MessageLite *)&to_msg[1]._internal_metadata_;
      arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) goto LAB_00235b42;
      goto LAB_00235af0;
    }
  }
  if ((unaff_EBP & 2) != 0) {
    *(undefined1 *)&to_msg[2]._vptr_MessageLite = *(undefined1 *)&from_msg[2]._vptr_MessageLite;
  }
LAB_00235b02:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void UninterpretedOption_NamePart::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<UninterpretedOption_NamePart*>(&to_msg);
  auto& from = static_cast<const UninterpretedOption_NamePart&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption.NamePart)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _this->_internal_set_name_part(from._internal_name_part());
    }
    if (cached_has_bits & 0x00000002u) {
      _this->_impl_.is_extension_ = from._impl_.is_extension_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}